

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O3

void clear_all_objects_selected(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object current;
  Am_Value_List all_objects;
  Am_Object local_28;
  Am_Value_List local_20;
  
  Am_Object::Get_Object(&local_28,(Am_Slot_Key)inter,10);
  pAVar2 = Am_Object::Get(&local_28,0x82,0);
  Am_Value_List::Am_Value_List(&local_20,pAVar2);
  Am_Object::~Am_Object(&local_28);
  local_28.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&local_20);
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_20);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&local_20);
    Am_Object::operator=(&local_28,pAVar2);
    Am_Object::Set(&local_28,0x172,false,1);
    Am_Value_List::Next(&local_20);
  }
  Am_Object::~Am_Object(&local_28);
  Am_Value_List::~Am_Value_List(&local_20);
  return;
}

Assistant:

void
clear_all_objects_selected(Am_Object &inter)
{
  Am_Value_List all_objects = inter.Get_Owner().Get(Am_GRAPHICAL_PARTS);
  Am_Object current;
  for (all_objects.Start(); !all_objects.Last(); all_objects.Next()) {
    current = all_objects.Get();
    Am_REPORT_SET_SEL_VALUE(true, inter, current, false);
    current.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
  }
}